

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O3

size_t union_uint32_card(uint32_t *set_1,size_t size_1,uint32_t *set_2,size_t size_2)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  uint32_t uVar5;
  
  sVar2 = size_1;
  if ((size_2 == 0) || (sVar2 = size_2, size_1 == 0)) {
    return sVar2;
  }
  uVar5 = *set_2;
  uVar3 = 0;
  sVar2 = 0;
  uVar4 = 0;
LAB_0010e229:
  do {
    while (sVar2 = sVar2 + 1, uVar5 <= set_1[uVar3]) {
      if (set_1[uVar3] <= uVar5) {
        uVar3 = uVar3 + 1;
        if ((size_1 <= uVar3) || (size_2 <= uVar4 + 1)) {
LAB_0010e271:
          uVar4 = uVar4 + 1;
          goto LAB_0010e274;
        }
        uVar5 = set_2[uVar4 + 1];
        uVar4 = uVar4 + 1;
        goto LAB_0010e229;
      }
      uVar1 = uVar4 + 1;
      if (size_2 <= uVar1) goto LAB_0010e271;
      uVar4 = uVar1;
      uVar5 = set_2[uVar1];
    }
    uVar3 = uVar3 + 1;
    if (size_1 <= uVar3) {
LAB_0010e274:
      if (size_1 < uVar3 || size_1 - uVar3 == 0) {
        if (uVar4 <= size_2 && size_2 - uVar4 != 0) {
          sVar2 = (size_2 - uVar4) + sVar2;
        }
      }
      else {
        sVar2 = (size_1 - uVar3) + sVar2;
      }
      return sVar2;
    }
  } while( true );
}

Assistant:

size_t union_uint32_card(const uint32_t *set_1, size_t size_1,
                         const uint32_t *set_2, size_t size_2) {
    size_t pos = 0, idx_1 = 0, idx_2 = 0;

    if (0 == size_2) {
        return size_1;
    }
    if (0 == size_1) {
        return size_2;
    }

    uint32_t val_1 = set_1[idx_1], val_2 = set_2[idx_2];

    while (true) {
        if (val_1 < val_2) {
            ++idx_1;
            ++pos;
            if (idx_1 >= size_1) break;
            val_1 = set_1[idx_1];
        } else if (val_2 < val_1) {
            ++idx_2;
            ++pos;
            if (idx_2 >= size_2) break;
            val_2 = set_2[idx_2];
        } else {
            ++idx_1;
            ++idx_2;
            ++pos;
            if (idx_1 >= size_1 || idx_2 >= size_2) break;
            val_1 = set_1[idx_1];
            val_2 = set_2[idx_2];
        }
    }

    if (idx_1 < size_1) {
        const size_t n_elems = size_1 - idx_1;
        pos += n_elems;
    } else if (idx_2 < size_2) {
        const size_t n_elems = size_2 - idx_2;
        pos += n_elems;
    }
    return pos;
}